

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGuiStb::is_word_boundary_from_right(ImGuiTextEditState *obj,int idx)

{
  int iVar1;
  unsigned_short *puVar2;
  bool bVar3;
  uint uVar4;
  
  if (idx < 1) {
    uVar4 = 1;
  }
  else {
    iVar1 = (obj->Text).Size;
    if (iVar1 < idx) {
LAB_0016ef87:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,
                    "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
    }
    puVar2 = (obj->Text).Data;
    bVar3 = is_separator((uint)puVar2[(ulong)(uint)idx - 1]);
    uVar4 = 0;
    if (bVar3) {
      if (iVar1 <= idx) goto LAB_0016ef87;
      bVar3 = is_separator((uint)puVar2[(uint)idx]);
      uVar4 = (uint)!bVar3;
    }
  }
  return uVar4;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator( obj->Text[idx-1] ) && !is_separator( obj->Text[idx] ) ) : 1; }